

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

pointer __thiscall gmlc::networking::TcpServer::findSocket(TcpServer *this,int connectorID)

{
  __shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  int in_EDX;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  __shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pVar5;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  lVar2 = CONCAT44(in_register_00000034,connectorID);
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,(mutex_type *)(lVar2 + 0x30));
  p_Var4 = *(__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> **)
            (lVar2 + 0xf8);
  p_Var1 = *(__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> **)
            (lVar2 + 0x100);
  lVar2 = (long)p_Var1 - (long)p_Var4;
  for (lVar3 = lVar2 >> 6; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (p_Var4->_M_ptr->idcode == in_EDX) goto LAB_00375ecf;
    if ((p_Var4[1]._M_ptr)->idcode == in_EDX) {
      p_Var4 = p_Var4 + 1;
      goto LAB_00375ecf;
    }
    if ((p_Var4[2]._M_ptr)->idcode == in_EDX) {
      p_Var4 = p_Var4 + 2;
      goto LAB_00375ecf;
    }
    if ((p_Var4[3]._M_ptr)->idcode == in_EDX) {
      p_Var4 = p_Var4 + 3;
      goto LAB_00375ecf;
    }
    p_Var4 = p_Var4 + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  if (lVar2 == 1) {
LAB_00375eb0:
    if (p_Var4->_M_ptr->idcode != in_EDX) {
      p_Var4 = p_Var1;
    }
LAB_00375ecf:
    if (p_Var4 != p_Var1) {
      std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this,
                 p_Var4);
      goto LAB_00375ee4;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_00375ea1:
      if (p_Var4->_M_ptr->idcode != in_EDX) {
        p_Var4 = p_Var4 + 1;
        goto LAB_00375eb0;
      }
      goto LAB_00375ecf;
    }
    if (lVar2 == 3) {
      if (p_Var4->_M_ptr->idcode != in_EDX) {
        p_Var4 = p_Var4 + 1;
        goto LAB_00375ea1;
      }
      goto LAB_00375ecf;
    }
  }
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00375ee4:
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  pVar5.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar5.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar5.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpServer::findSocket(int connectorID) const
{
    std::unique_lock<std::mutex> lock(accepting);
    auto ptr = std::find_if(
        connections.begin(),
        connections.end(),
        [connectorID](const auto& conn) {
            return (conn->getIdentifier() == connectorID);
        });
    if (ptr != connections.end()) {
        return *ptr;
    }
    return nullptr;
}